

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

int32_t utrie_unserializeDummy_63
                  (UTrie *trie,void *data,int32_t length,uint32_t initialValue,
                  uint32_t leadUnitValue,UBool make16BitTrie,UErrorCode *pErrorCode)

{
  UBool UVar1;
  short sVar2;
  int iVar3;
  uint32_t *puVar4;
  uint32_t *p32;
  int iStack_44;
  uint16_t block;
  int32_t limit;
  int32_t i;
  int32_t latin1Length;
  int32_t actualLength;
  uint16_t *p16;
  UBool make16BitTrie_local;
  uint32_t leadUnitValue_local;
  uint32_t initialValue_local;
  int32_t length_local;
  void *data_local;
  UTrie *trie_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    trie_local._4_4_ = -1;
  }
  else {
    trie->indexLength = 0x820;
    trie->dataLength = 0x100;
    if (leadUnitValue != initialValue) {
      trie->dataLength = trie->dataLength + 0x20;
    }
    if (make16BitTrie == '\0') {
      iVar3 = trie->dataLength * 4;
    }
    else {
      iVar3 = trie->dataLength * 2;
    }
    i = iVar3 + trie->indexLength * 2;
    if (length < i) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      trie_local._4_4_ = i;
    }
    else {
      trie->isLatin1Linear = '\x01';
      trie->initialValue = initialValue;
      trie->index = (uint16_t *)data;
      if (make16BitTrie == '\0') {
        memset(data,0,(long)(trie->indexLength << 1));
        if (leadUnitValue != initialValue) {
          for (iStack_44 = 0x6c0; iStack_44 < 0x6e0; iStack_44 = iStack_44 + 1) {
            *(undefined2 *)((long)data + (long)iStack_44 * 2) = 0x40;
          }
        }
        puVar4 = (uint32_t *)((long)data + (long)trie->indexLength * 2);
        trie->data32 = puVar4;
        for (iStack_44 = 0; iStack_44 < 0x100; iStack_44 = iStack_44 + 1) {
          puVar4[iStack_44] = initialValue;
        }
        if (leadUnitValue != initialValue) {
          for (; iStack_44 < 0x120; iStack_44 = iStack_44 + 1) {
            puVar4[iStack_44] = leadUnitValue;
          }
        }
      }
      else {
        sVar2 = (short)(trie->indexLength >> 2);
        iVar3 = trie->indexLength;
        for (iStack_44 = 0; iStack_44 < iVar3; iStack_44 = iStack_44 + 1) {
          *(short *)((long)data + (long)iStack_44 * 2) = sVar2;
        }
        if (leadUnitValue != initialValue) {
          for (iStack_44 = 0x6c0; iStack_44 < 0x6e0; iStack_44 = iStack_44 + 1) {
            *(short *)((long)data + (long)iStack_44 * 2) = sVar2 + 0x40;
          }
        }
        trie->data32 = (uint32_t *)0x0;
        iVar3 = trie->indexLength;
        for (iStack_44 = 0; iStack_44 < 0x100; iStack_44 = iStack_44 + 1) {
          *(short *)((long)data + (long)iStack_44 * 2 + (long)iVar3 * 2) = (short)initialValue;
        }
        if (leadUnitValue != initialValue) {
          for (; iStack_44 < 0x120; iStack_44 = iStack_44 + 1) {
            *(short *)((long)data + (long)iStack_44 * 2 + (long)iVar3 * 2) = (short)leadUnitValue;
          }
        }
      }
      trie->getFoldingOffset = utrie_defaultGetFoldingOffset_63;
      trie_local._4_4_ = i;
    }
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_unserializeDummy(UTrie *trie,
                       void *data, int32_t length,
                       uint32_t initialValue, uint32_t leadUnitValue,
                       UBool make16BitTrie,
                       UErrorCode *pErrorCode) {
    uint16_t *p16;
    int32_t actualLength, latin1Length, i, limit;
    uint16_t block;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return -1;
    }

    /* calculate the actual size of the dummy trie data */

    /* max(Latin-1, block 0) */
    latin1Length= 256; /*UTRIE_SHIFT<=8 ? 256 : UTRIE_DATA_BLOCK_LENGTH;*/

    trie->indexLength=UTRIE_BMP_INDEX_LENGTH+UTRIE_SURROGATE_BLOCK_COUNT;
    trie->dataLength=latin1Length;
    if(leadUnitValue!=initialValue) {
        trie->dataLength+=UTRIE_DATA_BLOCK_LENGTH;
    }

    actualLength=trie->indexLength*2;
    if(make16BitTrie) {
        actualLength+=trie->dataLength*2;
    } else {
        actualLength+=trie->dataLength*4;
    }

    /* enough space for the dummy trie? */
    if(length<actualLength) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return actualLength;
    }

    trie->isLatin1Linear=TRUE;
    trie->initialValue=initialValue;

    /* fill the index and data arrays */
    p16=(uint16_t *)data;
    trie->index=p16;

    if(make16BitTrie) {
        /* indexes to block 0 */
        block=(uint16_t)(trie->indexLength>>UTRIE_INDEX_SHIFT);
        limit=trie->indexLength;
        for(i=0; i<limit; ++i) {
            p16[i]=block;
        }

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block+=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=NULL;

        /* Latin-1 data */
        p16+=trie->indexLength;
        for(i=0; i<latin1Length; ++i) {
            p16[i]=(uint16_t)initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p16[i]=(uint16_t)leadUnitValue;
            }
        }
    } else {
        uint32_t *p32;

        /* indexes to block 0 */
        uprv_memset(p16, 0, trie->indexLength*2);

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=p32=(uint32_t *)(p16+trie->indexLength);

        /* Latin-1 data */
        for(i=0; i<latin1Length; ++i) {
            p32[i]=initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p32[i]=leadUnitValue;
            }
        }
    }

    trie->getFoldingOffset=utrie_defaultGetFoldingOffset;

    return actualLength;
}